

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_differencer_unittest.cc
# Opt level: O1

void __thiscall
google::protobuf::anon_unknown_0::ComparisonTest_AddDelete_FieldOrderingTest_Test::
~ComparisonTest_AddDelete_FieldOrderingTest_Test
          (ComparisonTest_AddDelete_FieldOrderingTest_Test *this)

{
  ComparisonTest::~ComparisonTest(&this->super_ComparisonTest);
  operator_delete(this,0x1118);
  return;
}

Assistant:

TEST_F(ComparisonTest, AddDelete_FieldOrderingTest) {
  orderings_proto1_.ClearExtension(unittest::my_extension_string);
  orderings_proto2_.clear_my_int();

  EXPECT_EQ(
      "deleted: my_int: 1\n"
      "added: (proto2_unittest.my_extension_string): \"bar\"\n",
      RunOrder());
}